

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_synth.cpp
# Opt level: O1

bool append_descriptor(vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
                       *bindings,vector<unsigned_int,_std::allocator<unsigned_int>_> *binding_flags,
                      uint32_t desc_set,uint32_t binding,VkDescriptorType desc_type,spvc_type type)

{
  vector<VkDescriptorSetLayoutBinding,std::allocator<VkDescriptorSetLayoutBinding>> *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  VkDescriptorSetLayoutBinding *pVVar1;
  iterator __position;
  iterator __position_00;
  spvc_bool sVar2;
  uint uVar3;
  SpvId SVar4;
  VkDescriptorSetLayoutBinding *pVVar5;
  VkDescriptorSetLayoutBinding *pVVar6;
  char *__format;
  long lVar7;
  uint32_t uVar8;
  bool bVar9;
  VkDescriptorSetLayoutBinding bind;
  uint local_5c;
  VkDescriptorSetLayoutBinding local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  if (desc_set < 8) {
    pVVar6 = bindings[desc_set].
             super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar1 = bindings[desc_set].
             super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar7 = ((long)pVVar1 - (long)pVVar6 >> 3) * -0x5555555555555555 >> 2;
    pVVar5 = pVVar6;
    if (0 < lVar7) {
      pVVar5 = pVVar6 + lVar7 * 4;
      lVar7 = lVar7 + 1;
      pVVar6 = pVVar6 + 2;
      do {
        if (pVVar6[-2].binding == binding) {
          pVVar6 = pVVar6 + -2;
          goto LAB_001197e0;
        }
        if (pVVar6[-1].binding == binding) {
          pVVar6 = pVVar6 + -1;
          goto LAB_001197e0;
        }
        if (pVVar6->binding == binding) goto LAB_001197e0;
        if (pVVar6[1].binding == binding) {
          pVVar6 = pVVar6 + 1;
          goto LAB_001197e0;
        }
        lVar7 = lVar7 + -1;
        pVVar6 = pVVar6 + 4;
      } while (1 < lVar7);
    }
    lVar7 = ((long)pVVar1 - (long)pVVar5 >> 3) * -0x5555555555555555;
    if (lVar7 == 1) {
LAB_001197c2:
      pVVar6 = pVVar5;
      if (pVVar5->binding != binding) {
        pVVar6 = pVVar1;
      }
    }
    else if (lVar7 == 2) {
LAB_001197b9:
      pVVar6 = pVVar5;
      if (pVVar5->binding != binding) {
        pVVar5 = pVVar5 + 1;
        goto LAB_001197c2;
      }
    }
    else {
      pVVar6 = pVVar1;
      if ((lVar7 == 3) && (pVVar6 = pVVar5, pVVar5->binding != binding)) {
        pVVar5 = pVVar5 + 1;
        goto LAB_001197b9;
      }
    }
LAB_001197e0:
    local_38 = binding_flags;
    uVar3 = spvc_type_get_num_array_dimensions(type);
    SVar4 = 1;
    if (uVar3 == 1) {
      sVar2 = spvc_type_array_dimension_is_literal(type,0);
      if (sVar2 == '\0') {
        append_descriptor();
        goto LAB_00119937;
      }
      SVar4 = spvc_type_get_array_dimension(type,0);
    }
    this = (vector<VkDescriptorSetLayoutBinding,std::allocator<VkDescriptorSetLayoutBinding>> *)
           (bindings + desc_set);
    __position._M_current = *(VkDescriptorSetLayoutBinding **)(this + 8);
    if (pVVar6 == __position._M_current) {
      local_58.pImmutableSamplers = (VkSampler *)0x0;
      local_58.descriptorCount = 1000000;
      if (SVar4 != 0) {
        local_58.descriptorCount = SVar4;
      }
      local_58.descriptorType = desc_type;
      local_58.binding = binding;
      local_58.stageFlags = 0x7fffffff;
      if (__position._M_current == *(VkDescriptorSetLayoutBinding **)(this + 0x10)) {
        std::vector<VkDescriptorSetLayoutBinding,std::allocator<VkDescriptorSetLayoutBinding>>::
        _M_realloc_insert<VkDescriptorSetLayoutBinding_const&>(this,__position,&local_58);
      }
      else {
        (__position._M_current)->pImmutableSamplers = (VkSampler *)0x0;
        (__position._M_current)->binding = binding;
        (__position._M_current)->descriptorType = desc_type;
        (__position._M_current)->descriptorCount = local_58.descriptorCount;
        (__position._M_current)->stageFlags = 0x7fffffff;
        *(long *)(this + 8) = *(long *)(this + 8) + 0x18;
      }
      this_00 = local_38 + desc_set;
      local_5c = (uint)(SVar4 == 0) << 3;
      __position_00._M_current =
           (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (this_00,__position_00,&local_5c);
      }
      else {
        *__position_00._M_current = local_5c;
        (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
      bVar9 = true;
    }
    else {
      if (pVVar6->descriptorType == desc_type) {
        uVar8 = 1000000;
        if (SVar4 != 0) {
          uVar8 = SVar4;
        }
        if (pVVar6->descriptorCount == uVar8) {
          return true;
        }
        __format = "Fossilize ERROR: Descriptor count mismatch for (%u, %u) (was %u, now %u).\n";
      }
      else {
        __format = 
        "Fossilize ERROR: Overlap in descriptor type for binding (%u, %u) (was %u, now %u).\n";
      }
      bVar9 = false;
      fprintf(_stderr,__format,(ulong)desc_set,(ulong)binding);
      fflush(_stderr);
    }
  }
  else {
    append_descriptor();
LAB_00119937:
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

static bool append_descriptor(std::vector<VkDescriptorSetLayoutBinding> *bindings,
                              std::vector<VkDescriptorBindingFlags> *binding_flags,
                              uint32_t desc_set, uint32_t binding,
                              VkDescriptorType desc_type, spvc_type type)
{
	if (desc_set >= 8)
	{
		LOGE("Descriptor set %u is out of range.\n", desc_set);
		return false;
	}

	auto &binds = bindings[desc_set];

	auto itr = std::find_if(binds.begin(), binds.end(), [&](const VkDescriptorSetLayoutBinding &bind) {
		return bind.binding == binding;
	});

	unsigned num_array_dimensions = spvc_type_get_num_array_dimensions(type);
	uint32_t desc_count = 1;
	if (num_array_dimensions == 1)
	{
		if (!spvc_type_array_dimension_is_literal(type, 0))
		{
			LOGE("Array size dimensions of resources must be constant literals.\n");
			return false;
		}
		desc_count = spvc_type_get_array_dimension(type, 0);
	}

	if (itr != binds.end())
	{
		if (itr->descriptorType != desc_type)
		{
			LOGE("Overlap in descriptor type for binding (%u, %u) (was %u, now %u).\n",
			     desc_set, binding, itr->descriptorType, desc_type);
			return false;
		}

		if (desc_count == 0)
			desc_count = 1000000;

		if (itr->descriptorCount != desc_count)
		{
			LOGE("Descriptor count mismatch for (%u, %u) (was %u, now %u).\n",
			     desc_set, binding, itr->descriptorCount, desc_count);
			return false;
		}
	}
	else
	{
		VkDescriptorSetLayoutBinding bind = {};
		bind.binding = binding;
		bind.stageFlags = VK_SHADER_STAGE_ALL;
		bind.descriptorType = desc_type;
		bind.descriptorCount = desc_count != 0 ? desc_count : 1000000;
		binds.push_back(bind);
		binding_flags[desc_set].push_back(desc_count == 0 ? VK_DESCRIPTOR_BINDING_VARIABLE_DESCRIPTOR_COUNT_BIT : 0);
	}

	return true;
}